

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::
RegisterTests(ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>
              *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  long *value_param;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  long *plVar13;
  uchar *obj_bytes;
  ostream *poVar14;
  size_t sVar15;
  const_iterator cVar16;
  char *pcVar17;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  ulong uVar18;
  pointer pIVar19;
  string param_name;
  string test_suite_name;
  string test_name;
  ParamGenerator<google::protobuf::internal::(anonymous_namespace)::TestParam> generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  pointer local_338;
  string local_328;
  long *local_308;
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>
  *local_2e0;
  size_t local_2d8;
  char *local_2d0;
  undefined8 local_2c8;
  char local_2c0;
  undefined7 uStack_2bf;
  string local_2b0;
  long *local_290;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  CodeLocation local_280;
  pointer local_258;
  pointer local_250;
  pointer local_248;
  ParamNameGeneratorFunc *local_240;
  char *local_238;
  long *local_230;
  long local_220 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  CodeLocation local_1e0;
  undefined1 local_1b8 [16];
  _func_Message_ptr_Arena_ptr *local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_2d0 = &local_2c0;
  local_2c8 = 0;
  local_2c0 = '\0';
  local_338 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_258 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_338 != local_258) {
    bVar9 = false;
    local_2e0 = this;
    do {
      pIVar19 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_250 = (this->instantiations_).
                  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar19 != local_250) {
        do {
          (*pIVar19->generator)(&local_290);
          local_240 = pIVar19->name_func;
          __s = pIVar19->file;
          iVar11 = pIVar19->line;
          if ((pIVar19->name)._M_string_length == 0) {
            local_2f8 = 0;
            *local_300 = 0;
          }
          else {
            local_1b8._0_8_ = &local_1a8;
            pcVar3 = (pIVar19->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b8,pcVar3,pcVar3 + (pIVar19->name)._M_string_length);
            std::__cxx11::string::append((char *)local_1b8);
            std::__cxx11::string::operator=((string *)&local_300,(string *)local_1b8);
            if ((_func_Message_ptr_Arena_ptr **)local_1b8._0_8_ != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8 + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_300,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_210._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_210._M_impl.super__Rb_tree_header._M_header;
          local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_248 = pIVar19;
          local_210._M_impl.super__Rb_tree_header._M_header._M_right =
               local_210._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar12 = (long *)(**(code **)(*local_290 + 0x10))();
          plVar13 = (long *)(**(code **)(*local_290 + 0x18))();
          if (plVar12 != plVar13) {
            local_2d8 = 0;
            local_308 = plVar12;
            do {
              cVar8 = (**(code **)(*plVar12 + 0x30))(plVar12,plVar13);
              if (cVar8 != '\0') break;
              obj_bytes = (uchar *)(**(code **)(*plVar12 + 0x28))(plVar12);
              local_2c8 = 0;
              *local_2d0 = '\0';
              local_1a8 = *(_func_Message_ptr_Arena_ptr **)(obj_bytes + 0x10);
              local_1b8._0_8_ = *(undefined8 *)obj_bytes;
              local_1b8._8_8_ = *(undefined8 *)(obj_bytes + 8);
              local_1a0 = local_2d8;
              (*local_240)(&local_328,
                           (TestParamInfo<google::protobuf::internal::(anonymous_namespace)::TestParam>
                            *)local_1b8);
              sVar6 = local_328._M_string_length;
              _Var5._M_p = local_328._M_dataplus._M_p;
              if (local_328._M_string_length == 0) {
                bVar9 = false;
              }
              else {
                bVar2 = *local_328._M_dataplus._M_p;
                iVar10 = isalnum((uint)bVar2);
                if ((bVar2 == 0x5f) || (iVar10 != 0)) {
                  uVar7 = 1;
                  do {
                    uVar18 = uVar7;
                    if (sVar6 == uVar18) break;
                    bVar2 = _Var5._M_p[uVar18];
                    iVar10 = isalnum((uint)bVar2);
                    uVar7 = uVar18 + 1;
                  } while ((bVar2 == 0x5f) || (iVar10 != 0));
                  bVar9 = sVar6 <= uVar18;
                }
                else {
                  bVar9 = false;
                }
              }
              bVar9 = IsTrue(bVar9);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_328._M_dataplus._M_p,
                                     local_328._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," line ",6);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,anon_var_dwarf_a12c75 + 5,0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              cVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_210,&local_328);
              bVar9 = IsTrue((_Rb_tree_header *)cVar16._M_node ==
                             &local_210._M_impl.super__Rb_tree_header);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_328._M_dataplus._M_p,
                                     local_328._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," line ",6);
                plVar12 = (long *)std::ostream::operator<<(poVar14,iVar11);
                std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                std::ostream::put((char)plVar12);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              peVar4 = (local_338->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar17 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_2d0,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar17);
              }
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_328._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_210,&local_328);
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b0,local_300,local_300 + local_2f8);
              pcVar17 = local_2d0;
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              PrintBytesInObjectTo(obj_bytes,0x18,(ostream *)&local_1a8);
              std::__cxx11::stringbuf::str();
              local_238 = pcVar17;
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              value_param = local_230;
              peVar4 = (local_338->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_280.file._M_dataplus._M_p = (pointer)&local_280.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_280,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              plVar12 = local_308;
              local_280.line = (peVar4->code_location).line;
              iVar10 = (*(local_2e0->super_ParameterizedTestSuiteInfoBase).
                         _vptr_ParameterizedTestSuiteInfoBase[3])();
              bVar9 = IsTrue(true);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                           ,0x6a);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1a0b9f8);
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,iVar11);
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              bVar9 = IsTrue(true);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                           ,0x6f);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1a0b9f8);
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,iVar11);
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)(((local_338->
                                                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->test_meta_factory)._M_t.
                                              super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_*,_false>
                                    + 0x10))();
              MakeAndRegisterTestInfo
                        (&local_2b0,local_238,(char *)0x0,(char *)value_param,&local_280,
                         (TypeId)CONCAT44(extraout_var,iVar10),(SetUpTestSuiteFunc)0x0,
                         (TearDownTestSuiteFunc)0x0,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280.file._M_dataplus._M_p != &local_280.file.field_2) {
                operator_delete(local_280.file._M_dataplus._M_p,
                                local_280.file.field_2._M_allocated_capacity + 1);
              }
              if (local_230 != local_220) {
                operator_delete(local_230,local_220[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              (**(code **)(*plVar12 + 0x18))(plVar12);
              local_2d8 = local_2d8 + 1;
              bVar9 = true;
            } while (plVar12 != plVar13);
          }
          this = local_2e0;
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))(plVar13);
          }
          if (plVar12 != (long *)0x0) {
            (**(code **)(*plVar12 + 8))(plVar12);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_210);
          if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
          }
          pIVar19 = local_248 + 1;
        } while (pIVar19 != local_250);
      }
      local_338 = local_338 + 1;
    } while (local_338 != local_258);
    if (bVar9) goto LAB_0090854f;
  }
  iVar11 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_1e0.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_1e0.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar11),&local_1e0,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
LAB_0090854f:
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,CONCAT71(uStack_2bf,local_2c0) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }